

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  thread logicThread;
  App app;
  MySimulator sim;
  thread local_1b8;
  App *local_1b0;
  code *local_1a8;
  undefined8 local_1a0;
  App local_198;
  Simulator local_128;
  undefined4 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  brown::Simulator::Simulator(&local_128);
  local_128._vptr_Simulator = (_func_int **)&PTR_hardwareLoop_00109d88;
  local_30 = 8;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  brown::App::App(&local_198,&local_128);
  local_1a8 = brown::App::runLogic;
  local_1a0 = 0;
  local_1b0 = &local_198;
  std::thread::thread<int(brown::App::*)(),brown::App*,void>
            (&local_1b8,(offset_in_App_to_subr *)&local_1a8,&local_1b0);
  iVar1 = brown::App::runGraphics(&local_198);
  std::thread::join();
  if (local_1b8._M_id._M_thread == 0) {
    brown::App::~App(&local_198);
    brown::Simulator::~Simulator(&local_128);
    return iVar1;
  }
  std::terminate();
}

Assistant:

int main(int argc, const char * argv[]) {
    brown::MySimulator sim;
    brown::App app(sim);
    std::thread logicThread(&brown::App::runLogic, &app);
    int retCode = app.runGraphics();
    logicThread.join();
    return retCode;
}